

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

long duckdb::BinaryLambdaWrapper::
     Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
               (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
               idx_t idx)

{
  size_type __n;
  size_type __n_00;
  char cVar1;
  char cVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  ulong uVar6;
  reference pvVar7;
  idx_t pos_tgt;
  size_type sVar8;
  ulong uVar9;
  size_type __n_01;
  vector<unsigned_long,_true> distances1;
  vector<unsigned_long,_true> distances0;
  allocator_type local_b9;
  ulong local_b8;
  long local_b0;
  long local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  vector<unsigned_long,_true> local_88;
  ulong local_70;
  size_type local_68;
  ulong local_60;
  value_type_conflict1 local_58;
  undefined8 local_50;
  long local_48;
  undefined8 local_40;
  long local_38;
  
  local_48 = right.value._0_8_;
  local_50 = left.value._8_8_;
  local_38 = left.value._0_8_;
  __n_01 = (size_type)left.value._8_4_;
  uVar6 = (ulong)fun.result & 0xffffffff;
  uVar9 = __n_01;
  if ((uVar6 != 0) && (uVar9 = uVar6, __n_01 != 0)) {
    local_b8._0_4_ = (uint)fun.result;
    local_b0 = local_38;
    if ((uint)local_b8 < 0xd) {
      local_b0 = (long)&local_40 + 4;
    }
    local_a8 = local_48;
    if (left.value._8_4_ < 0xd) {
      local_a8 = (long)&local_50 + 4;
    }
    __n = __n_01 + 1;
    local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8 = uVar6;
    local_40 = fun.result;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,__n,
               (value_type_conflict1 *)&local_a0,(allocator_type *)&local_58);
    local_58 = 0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a0,__n,&local_58,
               &local_b9);
    sVar8 = 0;
    do {
      pvVar7 = vector<unsigned_long,_true>::operator[](&local_88,sVar8);
      *pvVar7 = sVar8;
      sVar8 = sVar8 + 1;
    } while (__n != sVar8);
    uVar9 = 0;
    local_68 = __n_01;
    while (uVar9 != local_b8) {
      pvVar7 = vector<unsigned_long,_true>::operator[]((vector<unsigned_long,_true> *)&local_a0,0);
      local_70 = uVar9 + 1;
      *pvVar7 = local_70;
      sVar8 = 0;
      local_60 = uVar9;
      do {
        __n_00 = sVar8 + 1;
        pvVar7 = vector<unsigned_long,_true>::operator[](&local_88,__n_00);
        vVar3 = *pvVar7;
        pvVar7 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)&local_a0,sVar8);
        vVar4 = *pvVar7;
        pvVar7 = vector<unsigned_long,_true>::operator[](&local_88,sVar8);
        vVar5 = *pvVar7;
        cVar1 = *(char *)(local_b0 + local_60);
        cVar2 = *(char *)(local_a8 + sVar8);
        pvVar7 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)&local_a0,__n_00);
        __n_01 = local_68;
        uVar6 = vVar5 + (cVar1 != cVar2);
        uVar9 = vVar4 + 1;
        if (uVar6 < vVar4 + 1) {
          uVar9 = uVar6;
        }
        if (vVar3 + 1 < uVar9) {
          uVar9 = vVar3 + 1;
        }
        *pvVar7 = uVar9;
        sVar8 = __n_00;
      } while (local_68 != __n_00);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,&local_a0);
      uVar9 = local_70;
    }
    pvVar7 = vector<unsigned_long,_true>::operator[](&local_88,__n_01);
    uVar9 = *pvVar7;
    if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return uVar9;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}